

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::FCDUTF16CollationIterator::normalize
          (FCDUTF16CollationIterator *this,UChar *from,UChar *to,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  int32_t iVar3;
  char16_t *pcVar4;
  UErrorCode *errorCode_local;
  UChar *to_local;
  UChar *from_local;
  FCDUTF16CollationIterator *this_local;
  
  Normalizer2Impl::decompose
            (this->nfcImpl,from,to,&this->normalized,(int32_t)((long)to - (long)from >> 1),errorCode
            );
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    this->segmentStart = from;
    this->segmentLimit = to;
    pcVar4 = UnicodeString::getBuffer(&this->normalized);
    (this->super_UTF16CollationIterator).start = pcVar4;
    pUVar1 = (this->super_UTF16CollationIterator).start;
    iVar3 = UnicodeString::length(&this->normalized);
    (this->super_UTF16CollationIterator).limit = pUVar1 + iVar3;
  }
  return UVar2 == '\0';
}

Assistant:

UBool
FCDUTF16CollationIterator::normalize(const UChar *from, const UChar *to, UErrorCode &errorCode) {
    // NFD without argument checking.
    U_ASSERT(U_SUCCESS(errorCode));
    nfcImpl.decompose(from, to, normalized, (int32_t)(to - from), errorCode);
    if(U_FAILURE(errorCode)) { return FALSE; }
    // Switch collation processing into the FCD buffer
    // with the result of normalizing [segmentStart, segmentLimit[.
    segmentStart = from;
    segmentLimit = to;
    start = normalized.getBuffer();
    limit = start + normalized.length();
    return TRUE;
}